

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

ssize_t __thiscall
duckdb_parquet::LogicalType::read(LogicalType *this,int __fd,void *__buf,size_t __nbytes)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ssize_t sVar6;
  ushort *__nbytes_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  TProtocol *this_01;
  int16_t fid;
  TType ftype;
  string fname;
  ushort local_76;
  int local_74;
  DecimalType *local_70;
  TimeType *local_68;
  TimestampType *local_60;
  IntType *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_00);
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  iVar2 = (*this_00->_vptr_TProtocol[0x19])(this_00,&local_50);
  local_58 = &this->INTEGER;
  local_60 = &this->TIMESTAMP;
  local_68 = &this->TIME;
  local_70 = &this->DECIMAL;
  do {
    __nbytes_00 = &local_76;
    this_01 = this_00;
    iVar3 = (*this_00->_vptr_TProtocol[0x1b])(this_00,&local_50,&local_74);
    if (local_74 == 0) {
      iVar4 = (*this_00->_vptr_TProtocol[0x1a])(this_00);
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      this_00->input_recursion_depth_ = this_00->input_recursion_depth_ - 1;
      return (ulong)(uint)(iVar4 + iVar3 + iVar2);
    }
    switch(local_76) {
    case 1:
      if (local_74 != 0xc) break;
      sVar6 = StringType::read((StringType *)this_01,__fd,__buf_00,(size_t)__nbytes_00);
      iVar4 = (int)sVar6;
      uVar1 = 1;
LAB_002c6b37:
      this->__isset = (_LogicalType__isset)((ushort)this->__isset | uVar1);
      goto LAB_002c6b50;
    case 2:
      if (local_74 == 0xc) {
        sVar6 = MapType::read((MapType *)this_01,__fd,__buf_00,(size_t)__nbytes_00);
        iVar4 = (int)sVar6;
        uVar1 = 2;
        goto LAB_002c6b37;
      }
      break;
    case 3:
      if (local_74 == 0xc) {
        sVar6 = ListType::read((ListType *)this_01,__fd,__buf_00,(size_t)__nbytes_00);
        iVar4 = (int)sVar6;
        uVar1 = 4;
        goto LAB_002c6b37;
      }
      break;
    case 4:
      if (local_74 == 0xc) {
        sVar6 = EnumType::read((EnumType *)this_01,__fd,__buf_00,(size_t)__nbytes_00);
        iVar4 = (int)sVar6;
        uVar1 = 8;
        goto LAB_002c6b37;
      }
      break;
    case 5:
      if (local_74 == 0xc) {
        sVar6 = DecimalType::read(local_70,__fd,__buf_00,(size_t)__nbytes_00);
        iVar4 = (int)sVar6;
        uVar1 = 0x10;
        goto LAB_002c6b37;
      }
      break;
    case 6:
      if (local_74 == 0xc) {
        sVar6 = DateType::read((DateType *)this_01,__fd,__buf_00,(size_t)__nbytes_00);
        iVar4 = (int)sVar6;
        uVar1 = 0x20;
        goto LAB_002c6b37;
      }
      break;
    case 7:
      if (local_74 == 0xc) {
        sVar6 = TimeType::read(local_68,__fd,__buf_00,(size_t)__nbytes_00);
        iVar4 = (int)sVar6;
        uVar1 = 0x40;
        goto LAB_002c6b37;
      }
      break;
    case 8:
      if (local_74 == 0xc) {
        sVar6 = TimestampType::read(local_60,__fd,__buf_00,(size_t)__nbytes_00);
        iVar4 = (int)sVar6;
        uVar1 = 0x80;
        goto LAB_002c6b37;
      }
      break;
    case 10:
      if (local_74 == 0xc) {
        sVar6 = IntType::read(local_58,__fd,__buf_00,(size_t)__nbytes_00);
        iVar4 = (int)sVar6;
        uVar1 = 0x100;
        goto LAB_002c6b37;
      }
      break;
    case 0xb:
      if (local_74 == 0xc) {
        sVar6 = NullType::read((NullType *)this_01,__fd,__buf_00,(size_t)__nbytes_00);
        iVar4 = (int)sVar6;
        uVar1 = 0x200;
        goto LAB_002c6b37;
      }
      break;
    case 0xc:
      if (local_74 == 0xc) {
        sVar6 = JsonType::read((JsonType *)this_01,__fd,__buf_00,(size_t)__nbytes_00);
        iVar4 = (int)sVar6;
        uVar1 = 0x400;
        goto LAB_002c6b37;
      }
      break;
    case 0xd:
      if (local_74 == 0xc) {
        sVar6 = BsonType::read((BsonType *)this_01,__fd,__buf_00,(size_t)__nbytes_00);
        iVar4 = (int)sVar6;
        uVar1 = 0x800;
        goto LAB_002c6b37;
      }
      break;
    case 0xe:
      if (local_74 == 0xc) {
        sVar6 = UUIDType::read((UUIDType *)this_01,__fd,__buf_00,(size_t)__nbytes_00);
        iVar4 = (int)sVar6;
        uVar1 = 0x1000;
        goto LAB_002c6b37;
      }
      break;
    case 0xf:
      if (local_74 == 0xc) {
        sVar6 = Float16Type::read((Float16Type *)this_01,__fd,__buf_00,(size_t)__nbytes_00);
        iVar4 = (int)sVar6;
        uVar1 = 0x2000;
        goto LAB_002c6b37;
      }
    }
    iVar4 = (*this_00->_vptr_TProtocol[0x2c])(this_00);
LAB_002c6b50:
    iVar5 = (*this_00->_vptr_TProtocol[0x1c])(this_00);
    iVar2 = iVar4 + iVar3 + iVar2 + iVar5;
  } while( true );
}

Assistant:

uint32_t LogicalType::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;


  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->STRING.read(iprot);
          this->__isset.STRING = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->MAP.read(iprot);
          this->__isset.MAP = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 3:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->LIST.read(iprot);
          this->__isset.LIST = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 4:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->ENUM.read(iprot);
          this->__isset.ENUM = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 5:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->DECIMAL.read(iprot);
          this->__isset.DECIMAL = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 6:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->DATE.read(iprot);
          this->__isset.DATE = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 7:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->TIME.read(iprot);
          this->__isset.TIME = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 8:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->TIMESTAMP.read(iprot);
          this->__isset.TIMESTAMP = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 10:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->INTEGER.read(iprot);
          this->__isset.INTEGER = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 11:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->UNKNOWN.read(iprot);
          this->__isset.UNKNOWN = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 12:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->JSON.read(iprot);
          this->__isset.JSON = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 13:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->BSON.read(iprot);
          this->__isset.BSON = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 14:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->UUID.read(iprot);
          this->__isset.UUID = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 15:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->FLOAT16.read(iprot);
          this->__isset.FLOAT16 = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  return xfer;
}